

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location.hh
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
tchecker::parsing::system::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *ostr,position *pos)

{
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  
  if (pos->filename != (filename_type *)0x0) {
    poVar1 = std::operator<<(ostr,(string *)pos->filename);
    std::operator<<(poVar1,':');
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)ostr,pos->line);
  poVar1 = std::operator<<(poVar1,'.');
  pbVar2 = (basic_ostream<char,_std::char_traits<char>_> *)
           std::ostream::operator<<((ostream *)poVar1,pos->column);
  return pbVar2;
}

Assistant:

std::basic_ostream<YYChar>&
  operator<< (std::basic_ostream<YYChar>& ostr, const position& pos)
  {
    if (pos.filename)
      ostr << *pos.filename << ':';
    return ostr << pos.line << '.' << pos.column;
  }